

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkt-proc-builder.hpp
# Opt level: O3

void __thiscall
yactfr::internal::PktProcBuilder::
_buildReadVarInstr<yactfr::internal::BeginReadVarSIntSelInstr,yactfr::VariantWithSignedIntegerSelectorType>
          (PktProcBuilder *this,StructureMemberType *memberType,
          VariantWithSignedIntegerSelectorType *varType,Proc *baseProc,Kind endInstrKind)

{
  bool bVar1;
  pointer puVar2;
  socklen_t *__addr_len;
  Proc *this_00;
  socklen_t *psVar3;
  shared_ptr<yactfr::internal::BeginReadVarSIntSelInstr> instr;
  shared_ptr<yactfr::internal::EndReadDataInstr> endInstr;
  undefined1 local_9d;
  Kind local_9c;
  element_type *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  element_type *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  undefined8 local_78;
  Proc *local_70;
  shared_ptr<yactfr::internal::Instr> local_68;
  Proc *local_58;
  StructureMemberType *local_50;
  shared_ptr<yactfr::internal::Instr> local_48;
  
  local_98 = (element_type *)0x0;
  local_9c = endInstrKind;
  local_58 = baseProc;
  local_50 = memberType;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<yactfr::internal::BeginReadVarSIntSelInstr,std::allocator<yactfr::internal::BeginReadVarSIntSelInstr>,yactfr::StructureMemberType_const*const&,yactfr::VariantWithSignedIntegerSelectorType_const&>
            (&_Stack_90,(BeginReadVarSIntSelInstr **)&local_98,
             (allocator<yactfr::internal::BeginReadVarSIntSelInstr> *)&local_88,&local_50,varType);
  puVar2 = (varType->super_VariantWithIntegerSelectorType<long_long>)._opts.
           super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((varType->super_VariantWithIntegerSelectorType<long_long>)._opts.
      super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    __addr_len = (socklen_t *)0x0;
    psVar3 = (socklen_t *)0x1;
    do {
      this_00 = (Proc *)((long)*(sockaddr **)&local_98[2]._theKind + (long)__addr_len * 0x38 + 8);
      local_88 = (element_type *)&PTR__DataTypeVisitor_002fe928;
      local_78 = 0;
      _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
      local_70 = this_00;
      DataType::accept((DataType *)
                       ((puVar2[(long)__addr_len]._M_t.
                         super___uniq_ptr_impl<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_const_yactfr::VariantTypeOption<long_long>_*,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>
                         .super__Head_base<0UL,_const_yactfr::VariantTypeOption<long_long>_*,_false>
                        ._M_head_impl)->_dt)._M_t.
                       super___uniq_ptr_impl<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_>
                       ,(int)&local_88,*(sockaddr **)&local_98[2]._theKind,__addr_len);
      local_88 = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<yactfr::internal::EndReadDataInstr,std::allocator<yactfr::internal::EndReadDataInstr>,yactfr::internal::Instr::Kind_const&,yactfr::StructureMemberType_const*const&,yactfr::VariantWithSignedIntegerSelectorType_const&>
                (&_Stack_80,(EndReadDataInstr **)&local_88,
                 (allocator<yactfr::internal::EndReadDataInstr> *)&local_9d,&local_9c,&local_50,
                 varType);
      local_68.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_88;
      local_68.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Stack_80._M_pi;
      local_88 = (element_type *)0x0;
      _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Proc::pushBack(this_00,&local_68);
      if (local_68.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (_Stack_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_80._M_pi);
      }
      puVar2 = (varType->super_VariantWithIntegerSelectorType<long_long>)._opts.
               super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar1 = psVar3 < (socklen_t *)
                       ((long)(varType->super_VariantWithIntegerSelectorType<long_long>)._opts.
                              super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<long_long>,_std::default_delete<const_yactfr::VariantTypeOption<long_long>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3);
      __addr_len = psVar3;
      psVar3 = (socklen_t *)(ulong)((int)psVar3 + 1);
    } while (bVar1);
  }
  local_48.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_98
  ;
  local_48.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Stack_90._M_pi;
  local_98 = (element_type *)0x0;
  _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Proc::pushBack(local_58,&local_48);
  if (local_48.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
  }
  return;
}

Assistant:

void PktProcBuilder::_buildReadVarInstr(const StructureMemberType * const memberType,
                                        const VarTypeT& varType, Proc& baseProc,
                                        const Instr::Kind endInstrKind)
{
    auto instr = std::make_shared<BeginReadVarInstrT>(memberType, varType);

    for (auto i = 0U; i < varType.size(); ++i) {
        auto& optProc = instr->opts()[i].proc();

        this->_buildReadInstr(nullptr, varType[i].dataType(), optProc);

        /*
         * The VM can push the procedure of each option as the current
         * one, so each one ends with an "end read variant" instruction
         * to be consistent with other begin/end instruction pairs.
         */
        auto endInstr = std::make_shared<EndReadDataInstr>(endInstrKind, memberType, varType);

        optProc.pushBack(std::move(endInstr));
    }

    baseProc.pushBack(std::move(instr));
}